

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog_utils.cc
# Opt level: O3

shared_ptr<spdlog::logger> __thiscall lf::base::InitLogger(base *this,string *name)

{
  logger *this_00;
  pointer __p_1;
  pattern_formatter *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer *__ptr;
  pointer __p;
  shared_ptr<spdlog::logger> sVar2;
  pattern_formatter *local_58;
  __uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_> local_50;
  _Head_base<0UL,_lf::base::LineFeedFormatter_*,_false> local_48;
  string local_40;
  
  spdlog::stdout_color_mt<spdlog::synchronous_factory>((spdlog *)this,name,automatic);
  this_00 = *(logger **)this;
  this_01 = (pattern_formatter *)operator_new(0xe0);
  local_40.field_2._M_allocated_capacity._0_2_ = 10;
  local_40._M_string_length = 1;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  spdlog::pattern_formatter::pattern_formatter(this_01,local,&local_40);
  local_58 = this_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT62(local_40.field_2._M_allocated_capacity._2_6_,
                             local_40.field_2._M_allocated_capacity._0_2_) + 1);
  }
  local_50._M_t.super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>
  .super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl =
       (tuple<spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>)operator_new(0x10);
  local_58 = (pattern_formatter *)0x0;
  *(undefined ***)
   local_50._M_t.
   super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
   super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = &PTR__LineFeedFormatter_00531df0
  ;
  *(pattern_formatter **)
   ((long)local_50._M_t.
          super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
          super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl + 8) = this_01;
  local_48._M_head_impl = (LineFeedFormatter *)0x0;
  spdlog::logger::set_formatter
            (this_00,(unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                     &local_50);
  if ((_Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>)
      local_50._M_t.
      super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
      super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl != (formatter *)0x0) {
    (**(code **)(*(long *)local_50._M_t.
                          super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>
                          .super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl + 8))();
  }
  local_50._M_t.super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>
  .super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl =
       (tuple<spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>)
       (_Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>)0x0;
  std::unique_ptr<lf::base::LineFeedFormatter,_std::default_delete<lf::base::LineFeedFormatter>_>::
  ~unique_ptr((unique_ptr<lf::base::LineFeedFormatter,_std::default_delete<lf::base::LineFeedFormatter>_>
               *)&local_48);
  _Var1._M_pi = extraout_RDX;
  if (local_58 != (pattern_formatter *)0x0) {
    std::default_delete<spdlog::pattern_formatter>::operator()
              ((default_delete<spdlog::pattern_formatter> *)&local_58,local_58);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<spdlog::logger> InitLogger(const std::string& name) {
  auto result = spdlog::stdout_color_mt(name);
  result->set_formatter(std::make_unique<LineFeedFormatter>(
      std::make_unique<spdlog::pattern_formatter>()));
  return result;
}